

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkFragments(MoleculeStamp *this)

{
  bool bVar1;
  ostream *poVar2;
  OpenMDException *this_00;
  difference_type dVar3;
  string *msg;
  undefined8 uVar4;
  ostringstream oss;
  iterator fi;
  MoleculeStamp *in_stack_fffffffffffffdb8;
  __normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
  *in_stack_fffffffffffffdc0;
  FragmentStamp **in_stack_fffffffffffffdc8;
  __normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
  in_stack_fffffffffffffdd0;
  __normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
  in_stack_fffffffffffffdd8;
  string local_1d8 [48];
  ostringstream local_1a8 [376];
  FragmentStamp **local_30;
  undefined8 local_28;
  FragmentStamp **local_20;
  FragmentStamp **local_18;
  FragmentStamp **local_10;
  
  local_18 = (FragmentStamp **)
             std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::begin
                       ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *
                        )in_stack_fffffffffffffdb8);
  local_20 = (FragmentStamp **)
             std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::end
                       ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *
                        )in_stack_fffffffffffffdb8);
  local_28 = 0;
  local_10 = (FragmentStamp **)
             std::
             find<__gnu_cxx::__normal_iterator<OpenMD::FragmentStamp**,std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>>,OpenMD::FragmentStamp*>
                       (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                        in_stack_fffffffffffffdc8);
  local_30 = (FragmentStamp **)
             std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::end
                       ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *
                        )in_stack_fffffffffffffdb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffdc0,
                     (__normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
                      *)in_stack_fffffffffffffdb8);
  if (!bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Error in Molecule ");
  getName_abi_cxx11_(in_stack_fffffffffffffdb8);
  poVar2 = std::operator<<(poVar2,local_1d8);
  this_00 = (OpenMDException *)std::operator<<(poVar2,":fragment[");
  std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::begin
            ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *)
             in_stack_fffffffffffffdb8);
  dVar3 = __gnu_cxx::operator-
                    (in_stack_fffffffffffffdc0,
                     (__normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
                      *)in_stack_fffffffffffffdb8);
  msg = (string *)std::ostream::operator<<(this_00,dVar3);
  std::operator<<((ostream *)msg,"] is missing\n");
  std::__cxx11::string::~string(local_1d8);
  uVar4 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,msg);
  __cxa_throw(uVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkFragments() {
    std::vector<FragmentStamp*>::iterator fi =
        std::find(fragmentStamps_.begin(), fragmentStamps_.end(),
                  static_cast<FragmentStamp*>(NULL));
    if (fi != fragmentStamps_.end()) {
      std::ostringstream oss;
      oss << "Error in Molecule " << getName() << ":fragment["
          << fi - fragmentStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }
  }